

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall
soul::StructuralParser::parseTopLevelDecl(StructuralParser *this,Namespace *parentNamespace)

{
  bool bVar1;
  RefCountedPtr<soul::SourceCodeText> *this_00;
  CodeLocation keywordLocation;
  RefCountedPtr<soul::SourceCodeText> local_a0;
  _func_int **local_98;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  CompileMessage local_60;
  undefined1 local_28 [16];
  
  parseImports(this,parentNamespace);
  local_a0.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_a0.object != (SourceCodeText *)0x0) {
    ((local_a0.object)->super_RefCountedObject).refCount =
         ((local_a0.object)->super_RefCountedObject).refCount + 1;
  }
  local_98 = (_func_int **)(this->super_SOULTokeniser).location.location.data;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29793c);
  if (bVar1) {
    local_70._0_8_ = local_a0.object;
    if (local_a0.object != (SourceCodeText *)0x0) {
      ((local_a0.object)->super_RefCountedObject).refCount =
           ((local_a0.object)->super_RefCountedObject).refCount + 1;
    }
    local_70._8_8_ = local_98;
    parseProcessorDecl((StructuralParser *)&stack0xffffffffffffffe8,(CodeLocation *)this,
                       (Namespace *)local_70);
    this_00 = (RefCountedPtr<soul::SourceCodeText> *)local_70;
  }
  else {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2994fa);
    if (bVar1) {
      local_80._0_8_ = local_a0.object;
      if (local_a0.object != (SourceCodeText *)0x0) {
        ((local_a0.object)->super_RefCountedObject).refCount =
             ((local_a0.object)->super_RefCountedObject).refCount + 1;
      }
      local_80._8_8_ = local_98;
      parseGraphDecl((StructuralParser *)(local_28 + 8),(CodeLocation *)this,(Namespace *)local_80);
      this_00 = (RefCountedPtr<soul::SourceCodeText> *)local_80;
    }
    else {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x297330);
      if (!bVar1) {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)0x29756b);
        if (bVar1) {
          Errors::importsMustBeAtStart<>();
          (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_60);
          CompileMessage::~CompileMessage(&local_60);
        }
        Errors::expectedTopLevelDecl<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_60);
        CompileMessage::~CompileMessage(&local_60);
        goto LAB_00203e46;
      }
      local_90._0_8_ = local_a0.object;
      if (local_a0.object != (SourceCodeText *)0x0) {
        ((local_a0.object)->super_RefCountedObject).refCount =
             ((local_a0.object)->super_RefCountedObject).refCount + 1;
      }
      local_90._8_8_ = local_98;
      parseNamespaceDecl((StructuralParser *)local_28,(CodeLocation *)this,(ModuleBase *)local_90);
      this_00 = (RefCountedPtr<soul::SourceCodeText> *)local_90;
    }
  }
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(this_00);
LAB_00203e46:
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_a0);
  return;
}

Assistant:

void parseTopLevelDecl (AST::Namespace& parentNamespace)
    {
        parseImports (parentNamespace);
        auto keywordLocation = location;

        if (matchIf (Keyword::processor))      { parseProcessorDecl (keywordLocation, parentNamespace); return; }
        if (matchIf (Keyword::graph))          { parseGraphDecl     (keywordLocation, parentNamespace); return; }
        if (matchIf (Keyword::namespace_))     { parseNamespaceDecl (keywordLocation, parentNamespace); return; }
        if (matches (Keyword::import))         throwError (Errors::importsMustBeAtStart());

        throwError (Errors::expectedTopLevelDecl());
    }